

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O1

void Gls_ManStop(Gls_Man_t *p)

{
  Vec_Str_t *pVVar1;
  Vec_Int_t *pVVar2;
  Vec_Wrd_t *__ptr;
  Vec_Wec_t *pVVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  
  pVVar1 = p->vLines;
  if (pVVar1->pArray != (char *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (char *)0x0;
  }
  if (pVVar1 != (Vec_Str_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vTypes;
  if (pVVar1->pArray != (char *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (char *)0x0;
  }
  if (pVVar1 != (Vec_Str_t *)0x0) {
    free(pVVar1);
  }
  pVVar2 = p->vIndexes;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vLut4s;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vLut4TTs;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vLut6s;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  __ptr = p->vLut6TTs;
  if (__ptr->pArray != (word *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (word *)0x0;
  }
  if (__ptr != (Vec_Wrd_t *)0x0) {
    free(__ptr);
  }
  pVVar2 = p->vBoxes;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vDelays;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar3 = p->vDelayIns;
  if (0 < pVVar3->nCap) {
    lVar6 = 8;
    lVar5 = 0;
    do {
      pvVar4 = *(void **)((long)&pVVar3->pArray->nCap + lVar6);
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
        *(undefined8 *)((long)&pVVar3->pArray->nCap + lVar6) = 0;
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 < pVVar3->nCap);
  }
  if (pVVar3->pArray != (Vec_Int_t *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (Vec_Int_t *)0x0;
  }
  pVVar3->nCap = 0;
  pVVar3->nSize = 0;
  free(pVVar3);
  pVVar3 = p->vDelayOuts;
  if (0 < pVVar3->nCap) {
    lVar6 = 8;
    lVar5 = 0;
    do {
      pvVar4 = *(void **)((long)&pVVar3->pArray->nCap + lVar6);
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
        *(undefined8 *)((long)&pVVar3->pArray->nCap + lVar6) = 0;
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 < pVVar3->nCap);
  }
  if (pVVar3->pArray != (Vec_Int_t *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (Vec_Int_t *)0x0;
  }
  pVVar3->nCap = 0;
  pVVar3->nSize = 0;
  free(pVVar3);
  pVVar2 = p->vOrderPis;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vOrderPos;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vOrderBoxes;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vOrderDelays;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vOrderLuts;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vOrderSeqs;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  free(p);
  return;
}

Assistant:

void Gls_ManStop( Gls_Man_t * p )
{
    Vec_StrFree( p->vLines );
    Vec_StrFree( p->vTypes );
    Vec_IntFree( p->vIndexes );
    Vec_IntFree( p->vLut4s );
    Vec_IntFree( p->vLut4TTs );
    Vec_IntFree( p->vLut6s );
    Vec_WrdFree( p->vLut6TTs );
    Vec_IntFree( p->vBoxes );
    Vec_IntFree( p->vDelays );
    Vec_WecFree( p->vDelayIns );
    Vec_WecFree( p->vDelayOuts );
    // ordering
    Vec_IntFree( p->vOrderPis );
    Vec_IntFree( p->vOrderPos );
    Vec_IntFree( p->vOrderBoxes );
    Vec_IntFree( p->vOrderDelays );
    Vec_IntFree( p->vOrderLuts );
    Vec_IntFree( p->vOrderSeqs );
    ABC_FREE( p );
}